

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall Js::ByteCodeWriter::StartCall(ByteCodeWriter *this,OpCode op,ArgSlot ArgCount)

{
  undefined4 in_EAX;
  undefined4 in_register_00000004;
  undefined8 uStack_28;
  OpLayoutStartCall data;
  
  uStack_28 = CONCAT44(in_register_00000004,in_EAX);
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x1c);
  uStack_28 = CONCAT26(ArgCount,(undefined6)uStack_28);
  Data::EncodeT<(Js::LayoutSize)0>(&this->m_byteCodeData,op,(void *)((long)&uStack_28 + 6),2,this);
  return;
}

Assistant:

void ByteCodeWriter::StartCall(OpCode op, ArgSlot ArgCount)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::StartCall);

        OpLayoutStartCall data;
        data.ArgCount = ArgCount;
        m_byteCodeData.Encode(op, &data, sizeof(data), this);
    }